

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

void __thiscall
cfd::TransactionContext::CollectInputUtxo
          (TransactionContext *this,vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos)

{
  pointer pUVar1;
  pointer pUVar2;
  long lVar3;
  Txid *pTVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  Txid *pTVar8;
  long lVar9;
  OutPoint outpoint;
  Utxo temp;
  UtxoData dest;
  Txid local_640;
  OutPoint local_620;
  Utxo local_5f8;
  UtxoData local_520;
  
  if (((utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
       super__Vector_impl_data._M_start !=
       (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
       super__Vector_impl_data._M_finish) &&
     (pUVar1 = (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
               _M_impl.super__Vector_impl_data._M_finish,
     pUVar2 = (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
              _M_impl.super__Vector_impl_data._M_start,
     uVar7 = cfd::core::Transaction::GetTxInCount(),
     ((long)pUVar1 - (long)pUVar2 >> 4) * -0x6474a8819ec8e951 - (ulong)uVar7 != 0)) {
    lVar9 = *(long *)&this->field_0x10;
    lVar3 = *(long *)&this->field_0x18;
    if (lVar9 != lVar3) {
      do {
        cfd::core::AbstractTxIn::GetTxid();
        uVar7 = cfd::core::AbstractTxIn::GetVout();
        cfd::core::OutPoint::OutPoint(&local_620,&local_640,uVar7);
        bVar5 = IsFindUtxoMap(this,&local_620,(UtxoData *)0x0);
        if (!bVar5) {
          pUVar1 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pUVar2 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pUVar1 != pUVar2) {
            pTVar8 = &pUVar1->txid;
            do {
              if ((*(uint *)&pTVar8[1]._vptr_Txid == uVar7) &&
                 (cVar6 = cfd::core::Txid::Equals(pTVar8), cVar6 != '\0')) {
                UtxoData::UtxoData(&local_520);
                memset(&local_5f8,0,0xd8);
                UtxoUtil::ConvertToUtxo
                          ((UtxoData *)
                           &pTVar8[-2].data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_5f8,&local_520)
                ;
                std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::
                emplace_back<cfd::UtxoData&>
                          ((vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *)&this->utxo_map_,
                           &local_520);
                UtxoData::~UtxoData(&local_520);
                break;
              }
              pTVar4 = pTVar8 + 0x26;
              pTVar8 = (Txid *)&pTVar8[0x27].data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
            } while ((pointer)&pTVar4->data_ != pUVar2);
          }
        }
        local_620.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b0f00;
        if (local_620.txid_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_620.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_640._vptr_Txid = (_func_int **)&PTR__Txid_002b0f00;
        if (local_640.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_640.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        lVar9 = lVar9 + 0x90;
      } while (lVar9 != lVar3);
    }
  }
  return;
}

Assistant:

void TransactionContext::CollectInputUtxo(const std::vector<UtxoData>& utxos) {
  if ((!utxos.empty()) && (utxo_map_.size() != GetTxInCount())) {
    for (const auto& txin_ref : vin_) {
      const Txid& txid = txin_ref.GetTxid();
      uint32_t vout = txin_ref.GetVout();

      OutPoint outpoint(txid, vout);
      if (!IsFindUtxoMap(outpoint)) {
        for (const auto& utxo : utxos) {
          if ((utxo.vout == vout) && utxo.txid.Equals(txid)) {
            UtxoData dest;
            Utxo temp;
            memset(&temp, 0, sizeof(temp));
            UtxoUtil::ConvertToUtxo(utxo, &temp, &dest);
            utxo_map_.emplace_back(dest);
            break;
          }
        }
      }
    }
  }
}